

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

void bloaty::ReadDWARFCompileUnits(File *file,DualMap *symbol_map,CU *skeleton,RangeSink *sink)

{
  string_view section;
  string_view section_00;
  size_type sVar1;
  _func_void *in_RDI;
  InfoReader reader;
  RangeSink *in_stack_00000108;
  File *in_stack_00000110;
  RangeSink *in_stack_00000438;
  DualMap *in_stack_00000440;
  Section in_stack_0000044c;
  InfoReader *in_stack_00000450;
  CU *skeleton_00;
  File *in_stack_ffffffffffffff28;
  InfoReader *in_stack_ffffffffffffff30;
  undefined8 local_8;
  
  local_8 = in_RDI;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x30));
  if (sVar1 == 0) {
    Throw((char *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  }
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)(local_8 + 0x20));
  if (sVar1 != 0) {
    ReadDWARFAddressRanges(in_stack_00000110,in_stack_00000108);
  }
  skeleton_00 = (CU *)&stack0xffffffffffffff60;
  dwarf::InfoReader::InfoReader(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,skeleton_00);
  ReadDWARFDebugInfo(in_stack_00000450,in_stack_0000044c,in_stack_00000440,in_stack_00000438);
  ReadDWARFDebugInfo(in_stack_00000450,in_stack_0000044c,in_stack_00000440,in_stack_00000438);
  section._M_str = (char *)skeleton;
  section._M_len = (size_t)sink;
  ReadDWARFPubNames((InfoReader *)reader.abbrev_tables_._M_h._M_single_bucket,section,
                    (RangeSink *)reader.abbrev_tables_._M_h._M_rehash_policy._M_next_resize);
  section_00._M_str = (char *)skeleton;
  section_00._M_len = (size_t)sink;
  ReadDWARFPubNames((InfoReader *)reader.abbrev_tables_._M_h._M_single_bucket,section_00,
                    (RangeSink *)reader.abbrev_tables_._M_h._M_rehash_policy._M_next_resize);
  dwarf::InfoReader::~InfoReader((InfoReader *)skeleton_00);
  return;
}

Assistant:

void ReadDWARFCompileUnits(const dwarf::File& file, const DualMap& symbol_map,
                           const dwarf::CU* skeleton, RangeSink* sink) {
  if (!file.debug_info.size()) {
    THROW("missing debug info");
  }

  if (file.debug_aranges.size()) {
    ReadDWARFAddressRanges(file, sink);
  }

  // Share a reader to avoid re-parsing debug abbreviations.
  dwarf::InfoReader reader(file, skeleton);

  ReadDWARFDebugInfo(reader, dwarf::InfoReader::Section::kDebugInfo, symbol_map,
                     sink);
  ReadDWARFDebugInfo(reader, dwarf::InfoReader::Section::kDebugTypes,
                     symbol_map, sink);
  ReadDWARFPubNames(reader, file.debug_pubnames, sink);
  ReadDWARFPubNames(reader, file.debug_pubtypes, sink);
}